

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator.hpp
# Opt level: O0

int __thiscall
ear::dsp::GainInterpolator<ear::dsp::LinearInterpVector>::block_cmp
          (GainInterpolator<ear::dsp::LinearInterpVector> *this,size_t block_idx,
          SampleIndex sample_idx)

{
  reference pvVar1;
  size_type sVar2;
  SampleIndex block_end;
  SampleIndex block_start;
  SampleIndex sample_idx_local;
  size_t block_idx_local;
  GainInterpolator<ear::dsp::LinearInterpVector> *this_local;
  
  if ((block_idx == 0) ||
     (pvVar1 = std::
               vector<std::pair<long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<long,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator[](&this->interp_points,block_idx - 1), pvVar1->first <= sample_idx)) {
    sVar2 = std::
            vector<std::pair<long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<long,_std::vector<float,_std::allocator<float>_>_>_>_>
            ::size(&this->interp_points);
    if ((block_idx < sVar2) &&
       (pvVar1 = std::
                 vector<std::pair<long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<long,_std::vector<float,_std::allocator<float>_>_>_>_>
                 ::operator[](&this->interp_points,block_idx), pvVar1->first <= sample_idx)) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int block_cmp(size_t block_idx, SampleIndex sample_idx) {
        if (block_idx > 0) {
          SampleIndex block_start = interp_points[block_idx - 1].first;
          if (sample_idx < block_start) return -1;
        }

        if (block_idx < interp_points.size()) {
          SampleIndex block_end = interp_points[block_idx].first;
          if (sample_idx >= block_end) return 1;
        }

        return 0;
      }